

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O2

void AArch64_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  arm64_reg aVar6;
  MCOperand *pMVar7;
  MCOperand *pMVar8;
  MCOperand *pMVar9;
  MCOperand *pMVar10;
  int64_t iVar11;
  int64_t iVar12;
  ulong uVar13;
  int64_t iVar14;
  undefined *puVar15;
  long lVar16;
  cs_insn *pcVar17;
  char *pcVar18;
  int iVar19;
  uint uVar20;
  char *pcVar21;
  int iVar22;
  uint uVar23;
  uint32_t *RegAsmOffset_2;
  int iVar24;
  char *AsmStrs_2;
  uint32_t *RegAsmOffset_1;
  uint val;
  char *AsmStrs;
  uint32_t *RegAsmOffset;
  uint local_68;
  
  uVar4 = MCInst_getOpcode(MI);
  if (uVar4 != 0x7c2) {
    uVar23 = uVar4 & 0xfffffffe;
    if ((uVar4 - 0x81e < 2) || (uVar4 - 0x500 < 2)) {
      pMVar7 = MCInst_getOperand(MI,0);
      pMVar8 = MCInst_getOperand(MI,1);
      pMVar9 = MCInst_getOperand(MI,2);
      pMVar10 = MCInst_getOperand(MI,3);
      _Var3 = MCOperand_isImm(pMVar9);
      if ((_Var3) &&
         ((iVar11 = MCOperand_getImm(pMVar9), iVar11 == 0 &&
          (_Var3 = MCOperand_isImm(pMVar10), _Var3)))) {
        iVar11 = MCOperand_getImm(pMVar10);
        if (iVar11 == 0x1f) {
          if (((uVar4 == 0x81f) || (uVar4 == 0x501)) && (uVar23 == 0x500)) {
            pcVar18 = "sxtw";
            goto LAB_00168709;
          }
        }
        else {
          if (iVar11 == 0xf) {
            pcVar21 = "sxth";
            pcVar18 = "uxth";
          }
          else {
            if (iVar11 != 7) goto LAB_00168834;
            pcVar21 = "sxtb";
            pcVar18 = "uxtb";
          }
          if (uVar23 == 0x500) {
            pcVar18 = pcVar21;
          }
          if (uVar23 == 0x500 || uVar4 != 0x81f) {
LAB_00168709:
            uVar4 = MCOperand_getReg(pMVar7);
            uVar4 = *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar4 - 1) * 4);
            uVar23 = MCOperand_getReg(pMVar8);
            uVar23 = getWRegFromXReg(uVar23);
            SStream_concat(O,"%s\t%s, %s",pcVar18,getRegisterName_AsmStrsNoRegAltName + uVar4,
                           getRegisterName_AsmStrsNoRegAltName +
                           *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName +
                                    (ulong)(uVar23 - 1) * 4));
            if (MI->csh->detail != CS_OPT_OFF) {
              pcVar2 = MI->flat_insn->detail;
              puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
              puVar1[0] = '\x01';
              puVar1[1] = '\0';
              puVar1[2] = '\0';
              puVar1[3] = '\0';
              uVar4 = MCOperand_getReg(pMVar7);
              pcVar2 = MI->flat_insn->detail;
              *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) =
                   uVar4;
              puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
              *puVar1 = *puVar1 + '\x01';
              pcVar2 = MI->flat_insn->detail;
              puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
              puVar1[0] = '\x01';
              puVar1[1] = '\0';
              puVar1[2] = '\0';
              puVar1[3] = '\0';
              uVar4 = MCOperand_getReg(pMVar8);
              uVar4 = getWRegFromXReg(uVar4);
              pcVar2 = MI->flat_insn->detail;
              *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) =
                   uVar4;
              puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
              *puVar1 = *puVar1 + '\x01';
            }
            aVar6 = AArch64_map_insn(pcVar18);
            MCInst_setOpcodePub(MI,aVar6);
            return;
          }
        }
      }
LAB_00168834:
      _Var3 = MCOperand_isImm(pMVar9);
      if ((!_Var3) || (_Var3 = MCOperand_isImm(pMVar10), !_Var3)) {
LAB_00168be0:
        iVar11 = MCOperand_getImm(pMVar9);
        iVar12 = MCOperand_getImm(pMVar10);
        uVar5 = MCOperand_getReg(pMVar7);
        uVar5 = *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar5 - 1) * 4);
        uVar20 = MCOperand_getReg(pMVar8);
        if (iVar12 < iVar11) {
          pcVar18 = "ubfiz";
          if (uVar23 == 0x500) {
            pcVar18 = "sbfiz";
          }
          SStream_concat(O,"%s\t%s, %s, ",pcVar18,getRegisterName_AsmStrsNoRegAltName + uVar5,
                         getRegisterName_AsmStrsNoRegAltName +
                         *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName +
                                  (ulong)(uVar20 - 1) * 4));
          iVar22 = (uint)(uVar4 == 0x501 || uVar4 == 0x81f) * 0x20 + 0x20;
          iVar11 = MCOperand_getImm(pMVar9);
          printInt32Bang(O,iVar22 - (int)iVar11);
          SStream_concat0(O,", ");
          iVar11 = MCOperand_getImm(pMVar10);
          printInt32Bang(O,(int)iVar11 + 1);
          aVar6 = AArch64_map_insn(pcVar18);
          MCInst_setOpcodePub(MI,aVar6);
          if (MI->csh->detail == CS_OPT_OFF) {
            return;
          }
          pcVar2 = MI->flat_insn->detail;
          puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar7);
          pcVar2 = MI->flat_insn->detail;
          *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
          puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar1 = *puVar1 + '\x01';
          pcVar2 = MI->flat_insn->detail;
          puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar8);
          pcVar2 = MI->flat_insn->detail;
          *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
          puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar1 = *puVar1 + '\x01';
          pcVar2 = MI->flat_insn->detail;
          puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          iVar11 = MCOperand_getImm(pMVar9);
          pcVar2 = MI->flat_insn->detail;
          *(long *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) =
               (long)(iVar22 - (int)iVar11);
          puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar1 = *puVar1 + '\x01';
          pcVar2 = MI->flat_insn->detail;
          puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          iVar11 = MCOperand_getImm(pMVar10);
          lVar16 = (long)((int)iVar11 + 1);
        }
        else {
          pcVar18 = "ubfx";
          if (uVar23 == 0x500) {
            pcVar18 = "sbfx";
          }
          SStream_concat(O,"%s\t%s, %s, ",pcVar18,getRegisterName_AsmStrsNoRegAltName + uVar5,
                         getRegisterName_AsmStrsNoRegAltName +
                         *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName +
                                  (ulong)(uVar20 - 1) * 4));
          iVar11 = MCOperand_getImm(pMVar9);
          printInt32Bang(O,(int32_t)iVar11);
          SStream_concat0(O,", ");
          iVar11 = MCOperand_getImm(pMVar10);
          iVar12 = MCOperand_getImm(pMVar9);
          printInt32Bang(O,((int)iVar11 - (int)iVar12) + 1);
          aVar6 = AArch64_map_insn(pcVar18);
          MCInst_setOpcodePub(MI,aVar6);
          if (MI->csh->detail == CS_OPT_OFF) {
            return;
          }
          pcVar2 = MI->flat_insn->detail;
          puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar7);
          pcVar2 = MI->flat_insn->detail;
          *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
          puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar1 = *puVar1 + '\x01';
          pcVar2 = MI->flat_insn->detail;
          puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar8);
          pcVar2 = MI->flat_insn->detail;
          *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
          puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar1 = *puVar1 + '\x01';
          pcVar2 = MI->flat_insn->detail;
          puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          iVar11 = MCOperand_getImm(pMVar9);
          pcVar2 = MI->flat_insn->detail;
          *(long *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) =
               (long)(int)iVar11;
          puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar1 = *puVar1 + '\x01';
          pcVar2 = MI->flat_insn->detail;
          puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          iVar11 = MCOperand_getImm(pMVar10);
          iVar12 = MCOperand_getImm(pMVar9);
          lVar16 = (long)(((int)iVar11 - (int)iVar12) + 1);
        }
        goto LAB_00168fd7;
      }
      iVar11 = MCOperand_getImm(pMVar9);
      val = (uint)iVar11;
      iVar11 = MCOperand_getImm(pMVar10);
      uVar5 = (uint)iVar11;
      uVar20 = uVar5 + 1 ^ val;
      if (((uVar4 ^ 0x81e) == 0 && uVar20 == 0) && uVar5 != 0x1f) {
        iVar22 = 0x1f;
LAB_001688bf:
        val = iVar22 - uVar5;
        pcVar18 = "lsl";
      }
      else {
        if ((uVar20 == 0 && (uVar4 ^ 0x81f) == 0) && uVar5 != 0x3f) {
          iVar22 = 0x3f;
          goto LAB_001688bf;
        }
        pcVar18 = "lsr";
        if (((uVar4 ^ 0x81e) != 0 || (uVar5 ^ 0x1f) != 0) &&
           ((uVar4 ^ 0x81f) != 0 || (uVar5 ^ 0x3f) != 0)) {
          pcVar18 = "asr";
          if ((uVar4 != 0x500 || (uVar5 ^ 0x1f) != 0) && (uVar4 != 0x501 || (uVar5 ^ 0x3f) != 0))
          goto LAB_00168be0;
        }
      }
      uVar4 = MCOperand_getReg(pMVar7);
      uVar4 = *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar4 - 1) * 4);
      uVar23 = MCOperand_getReg(pMVar8);
      SStream_concat(O,"%s\t%s, %s, ",pcVar18,getRegisterName_AsmStrsNoRegAltName + uVar4,
                     getRegisterName_AsmStrsNoRegAltName +
                     *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar23 - 1) * 4));
      printInt32Bang(O,val);
      aVar6 = AArch64_map_insn(pcVar18);
      MCInst_setOpcodePub(MI,aVar6);
      if (MI->csh->detail == CS_OPT_OFF) {
        return;
      }
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar4 = MCOperand_getReg(pMVar7);
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar4 = MCOperand_getReg(pMVar8);
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(long *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) =
           (long)(int)val;
      pcVar17 = MI->flat_insn;
    }
    else {
      if (uVar23 != 0x66) goto switchD_00167f5d_caseD_2;
      pMVar7 = MCInst_getOperand(MI,0);
      pMVar8 = MCInst_getOperand(MI,2);
      pMVar9 = MCInst_getOperand(MI,3);
      iVar11 = MCOperand_getImm(pMVar9);
      pMVar9 = MCInst_getOperand(MI,4);
      iVar12 = MCOperand_getImm(pMVar9);
      iVar22 = (int)iVar12;
      iVar24 = (int)iVar11;
      if (iVar22 < iVar24) {
        iVar19 = (uint)(uVar4 == 0x67) * 0x20 + 0x20;
        iVar19 = (iVar19 - iVar24) % iVar19;
        uVar4 = MCOperand_getReg(pMVar7);
        uVar4 = *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar4 - 1) * 4);
        uVar23 = MCOperand_getReg(pMVar8);
        SStream_concat(O,"bfi\t%s, %s, ",getRegisterName_AsmStrsNoRegAltName + uVar4,
                       getRegisterName_AsmStrsNoRegAltName +
                       *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar23 - 1) * 4)
                      );
        printInt32Bang(O,iVar19);
        SStream_concat0(O,", ");
        printInt32Bang(O,iVar22 + 1);
        aVar6 = AArch64_map_insn("bfi");
        MCInst_setOpcodePub(MI,aVar6);
        if (MI->csh->detail == CS_OPT_OFF) {
          return;
        }
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar4 = MCOperand_getReg(pMVar7);
        pcVar2 = MI->flat_insn->detail;
        *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar4 = MCOperand_getReg(pMVar8);
        pcVar2 = MI->flat_insn->detail;
        *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        *(long *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) =
             (long)iVar19;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        lVar16 = (long)(iVar22 + 1);
      }
      else {
        iVar22 = (iVar22 - iVar24) + 1;
        uVar4 = MCOperand_getReg(pMVar7);
        uVar4 = *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar4 - 1) * 4);
        uVar23 = MCOperand_getReg(pMVar8);
        SStream_concat(O,"bfxil\t%s, %s, ",getRegisterName_AsmStrsNoRegAltName + uVar4,
                       getRegisterName_AsmStrsNoRegAltName +
                       *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar23 - 1) * 4)
                      );
        printInt32Bang(O,iVar24);
        SStream_concat0(O,", ");
        printInt32Bang(O,iVar22);
        aVar6 = AArch64_map_insn("bfxil");
        MCInst_setOpcodePub(MI,aVar6);
        if (MI->csh->detail == CS_OPT_OFF) {
          return;
        }
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar4 = MCOperand_getReg(pMVar7);
        pcVar2 = MI->flat_insn->detail;
        *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar4 = MCOperand_getReg(pMVar8);
        pcVar2 = MI->flat_insn->detail;
        *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        *(long *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) =
             (long)iVar24;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        lVar16 = (long)iVar22;
      }
LAB_00168fd7:
      pcVar2 = MI->flat_insn->detail;
      *(long *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) = lVar16;
      pcVar17 = MI->flat_insn;
    }
    goto LAB_00168ff9;
  }
  pMVar7 = MCInst_getOperand(MI,0);
  local_68 = 1;
  pMVar8 = MCInst_getOperand(MI,1);
  pMVar9 = MCInst_getOperand(MI,2);
  pMVar10 = MCInst_getOperand(MI,3);
  iVar11 = MCOperand_getImm(pMVar7);
  iVar12 = MCOperand_getImm(pMVar8);
  uVar13 = MCOperand_getImm(pMVar9);
  iVar14 = MCOperand_getImm(pMVar10);
  uVar23 = (uint)iVar14;
  iVar22 = (int)iVar11;
  uVar4 = uVar23;
  if ((int)iVar12 == 8) {
    switch(uVar13 & 0xffffffff) {
    case 0:
      if (iVar22 != 4) goto switchD_00167f5d_caseD_2;
      uVar5 = 0x1c3;
      uVar4 = 0;
      if (uVar23 == 1) {
        iVar24 = 0xf;
        pcVar18 = "tlbi\tipas2e1is";
      }
      else {
        if (uVar23 != 5) goto switchD_00167f5d_caseD_2;
        iVar24 = 0x10;
        pcVar18 = "tlbi\tipas2le1is";
      }
      break;
    default:
      goto switchD_00167f5d_caseD_2;
    case 3:
      if (iVar22 != 6) {
        if (iVar22 == 4) {
          if ((6 < uVar23) || ((0x73U >> (uVar23 & 0x1f) & 1) == 0)) goto switchD_00167f5d_caseD_2;
          uVar13 = (ulong)((uVar23 & 7) << 2);
          pcVar18 = &DAT_001dac6c + *(int *)(&DAT_001dac6c + uVar13);
          puVar15 = &DAT_001dac88;
        }
        else {
          if (((iVar22 != 0) || (7 < uVar23)) || ((0xafU >> (uVar23 & 0x1f) & 1) == 0))
          goto switchD_00167f5d_caseD_2;
          uVar13 = (ulong)((uVar23 & 7) << 2);
          pcVar18 = &DAT_001dac4c + *(int *)(&DAT_001dac4c + uVar13);
          puVar15 = &DAT_001dc748;
        }
LAB_00168b72:
        iVar24 = *(int *)(puVar15 + uVar13);
        uVar5 = 0x1c3;
        uVar4 = 0;
        break;
      }
      uVar5 = 0x1c3;
      if (uVar23 != 0) {
        if (uVar23 == 5) {
          uVar4 = 0;
          iVar24 = 0xe;
          pcVar18 = "tlbi\tvale3is";
        }
        else {
          if (uVar23 != 1) goto switchD_00167f5d_caseD_2;
          uVar4 = 0;
          iVar24 = 0xd;
          pcVar18 = "tlbi\tvae3is";
        }
        break;
      }
      iVar24 = 0xc;
      pcVar18 = "tlbi\talle3is";
LAB_00169261:
      uVar5 = 0x1c3;
      local_68 = uVar23;
      goto LAB_00169125;
    case 4:
      if (iVar22 != 4) goto switchD_00167f5d_caseD_2;
      uVar5 = 0x1c3;
      uVar4 = 0;
      if (uVar23 == 1) {
        iVar24 = 0x11;
        pcVar18 = "tlbi\tipas2e1";
      }
      else {
        if (uVar23 != 5) goto switchD_00167f5d_caseD_2;
        iVar24 = 0x12;
        pcVar18 = "tlbi\tipas2le1";
      }
      break;
    case 7:
      if (iVar22 != 6) {
        if (iVar22 == 4) {
          if ((6 < uVar23) || ((0x73U >> (uVar23 & 0x1f) & 1) == 0)) goto switchD_00167f5d_caseD_2;
          uVar13 = (ulong)((uVar23 & 7) << 2);
          pcVar18 = &DAT_001dacc4 + *(int *)(&DAT_001dacc4 + uVar13);
          puVar15 = &DAT_001dace0;
        }
        else {
          if (((iVar22 != 0) || (7 < uVar23)) || ((0xafU >> (uVar23 & 0x1f) & 1) == 0))
          goto switchD_00167f5d_caseD_2;
          uVar13 = (ulong)((uVar23 & 7) << 2);
          pcVar18 = &DAT_001daca4 + *(int *)(&DAT_001daca4 + uVar13);
          puVar15 = &DAT_001dc768;
        }
        goto LAB_00168b72;
      }
      uVar5 = 0x1c3;
      if (uVar23 == 0) {
        iVar24 = 0x1e;
        pcVar18 = "tlbi\talle3";
        goto LAB_00169261;
      }
      if (uVar23 == 5) {
        uVar4 = 0;
        iVar24 = 0x20;
        pcVar18 = "tlbi\tvale3";
      }
      else {
        if (uVar23 != 1) goto switchD_00167f5d_caseD_2;
        uVar4 = 0;
        iVar24 = 0x1f;
        pcVar18 = "tlbi\tvae3";
      }
    }
LAB_0016911c:
    local_68 = 0;
    goto LAB_00169123;
  }
  if ((int)iVar12 != 7) {
switchD_00167f5d_caseD_2:
    pcVar18 = printAliasInstr(MI,O,Info);
    if (pcVar18 == (char *)0x0) {
      printInstruction(MI,O,(MCRegisterInfo *)Info);
      return;
    }
    aVar6 = AArch64_map_insn(pcVar18);
    MCInst_setOpcodePub(MI,aVar6);
    (*cs_mem_free)(pcVar18);
    return;
  }
  switch((int)uVar13) {
  case 1:
    if (iVar22 != 0 || uVar23 != 0) goto switchD_00167f5d_caseD_2;
    uVar23 = 1;
    pcVar18 = "ic\tialluis";
    goto LAB_00168aaf;
  default:
    goto switchD_00167f5d_caseD_2;
  case 4:
    if (uVar23 != 1 || iVar22 != 3) goto switchD_00167f5d_caseD_2;
    pcVar18 = "dc\tzva";
    break;
  case 5:
    if (iVar22 == 0 && uVar23 == 0) {
      uVar23 = 2;
      pcVar18 = "ic\tiallu";
    }
    else {
      if (uVar23 != 1 || iVar22 != 3) goto switchD_00167f5d_caseD_2;
      uVar23 = 3;
      pcVar18 = "ic\tivau";
    }
LAB_00168aaf:
    iVar24 = 0;
    uVar5 = 0x1c0;
    local_68 = 0;
    uVar4 = 0;
    goto LAB_00169125;
  case 6:
    uVar5 = 0x1c1;
    iVar24 = 0;
    if (uVar23 == 2 && iVar22 == 0) {
      pcVar18 = "dc\tisw";
      uVar4 = 0;
      local_68 = 3;
    }
    else {
      if (iVar22 != 0 || uVar23 != 1) goto switchD_00167f5d_caseD_2;
      pcVar18 = "dc\tivac";
      uVar4 = 0;
      local_68 = 2;
    }
    goto LAB_00169123;
  case 8:
    if (iVar22 == 6) {
      uVar5 = 0x1c2;
      if (uVar23 == 0) {
        pcVar18 = "at\ts1e3r";
        iVar24 = 0;
        uVar4 = 10;
        local_68 = uVar23;
        goto LAB_00169125;
      }
      if (uVar23 != 1) goto switchD_00167f5d_caseD_2;
      uVar4 = 0xb;
      iVar24 = 0;
      pcVar18 = "at\ts1e3w";
    }
    else {
      if (iVar22 == 4) {
        if ((7 < uVar23) || ((0xf3U >> (uVar23 & 0x1f) & 1) == 0)) goto switchD_00167f5d_caseD_2;
        uVar4 = (uVar23 & 7) << 2;
        pcVar18 = &DAT_001dac2c + *(int *)(&DAT_001dac2c + uVar4);
        uVar4 = *(uint *)(&DAT_001dc728 + uVar4);
      }
      else {
        if ((iVar22 != 0) || (3 < uVar23)) goto switchD_00167f5d_caseD_2;
        pcVar18 = &DAT_001dac1c + *(int *)(&DAT_001dac1c + (ulong)(uVar23 & 3) * 4);
      }
      uVar5 = 0x1c2;
      iVar24 = 0;
    }
    goto LAB_0016911c;
  case 10:
    if (uVar23 == 1 && iVar22 == 3) {
      local_68 = 4;
      pcVar18 = "dc\tcvac";
    }
    else {
      if (iVar22 != 0 || uVar23 != 2) goto switchD_00167f5d_caseD_2;
      local_68 = 5;
      pcVar18 = "dc\tcsw";
    }
    break;
  case 0xb:
    if (uVar23 != 1 || iVar22 != 3) goto switchD_00167f5d_caseD_2;
    local_68 = 6;
    pcVar18 = "dc\tcvau";
    break;
  case 0xe:
    if (uVar23 == 1 && iVar22 == 3) {
      local_68 = 7;
      pcVar18 = "dc\tcivac";
    }
    else {
      if (iVar22 != 0 || uVar23 != 2) goto switchD_00167f5d_caseD_2;
      local_68 = 8;
      pcVar18 = "dc\tcisw";
    }
  }
  iVar24 = 0;
  uVar5 = 0x1c1;
  uVar4 = 0;
LAB_00169123:
  uVar23 = 0;
LAB_00169125:
  MCInst_setOpcodePub(MI,uVar5);
  SStream_concat0(O,pcVar18);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
    puVar1[0] = 'D';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) =
         local_68 + uVar23 + uVar4 + iVar24;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar1 = *puVar1 + '\x01';
  }
  pcVar18 = strstr(pcVar18,"all");
  if (pcVar18 == (char *)0x0) {
    pMVar7 = MCInst_getOperand(MI,4);
    uVar4 = MCOperand_getReg(pMVar7);
    SStream_concat(O,", %s",getRegisterName_AsmStrsNoRegAltName +
                            *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName +
                                     (ulong)(uVar4 - 1) * 4));
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
      pcVar17 = MI->flat_insn;
LAB_00168ff9:
      puVar1 = (pcVar17->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  return;
}

Assistant:

void AArch64_printInst(MCInst *MI, SStream *O, void *Info)
{
	// Check for special encodings and print the canonical alias instead.
	unsigned Opcode = MCInst_getOpcode(MI);
	int LSB;
	int Width;
	char *mnem;

	if (Opcode == AArch64_SYSxt && printSysAlias(MI, O))
		return;

	// SBFM/UBFM should print to a nicer aliased form if possible.
	if (Opcode == AArch64_SBFMXri || Opcode == AArch64_SBFMWri ||
			Opcode == AArch64_UBFMXri || Opcode == AArch64_UBFMWri) {
		MCOperand *Op0 = MCInst_getOperand(MI, 0);
		MCOperand *Op1 = MCInst_getOperand(MI, 1);
		MCOperand *Op2 = MCInst_getOperand(MI, 2);
		MCOperand *Op3 = MCInst_getOperand(MI, 3);

		bool IsSigned = (Opcode == AArch64_SBFMXri || Opcode == AArch64_SBFMWri);
		bool Is64Bit = (Opcode == AArch64_SBFMXri || Opcode == AArch64_UBFMXri);

		if (MCOperand_isImm(Op2) && MCOperand_getImm(Op2) == 0 && MCOperand_isImm(Op3)) {
			char *AsmMnemonic = NULL;

			switch (MCOperand_getImm(Op3)) {
				default:
					break;
				case 7:
					if (IsSigned)
						AsmMnemonic = "sxtb";
					else if (!Is64Bit)
						AsmMnemonic = "uxtb";
					break;
				case 15:
					if (IsSigned)
						AsmMnemonic = "sxth";
					else if (!Is64Bit)
						AsmMnemonic = "uxth";
					break;
				case 31:
					// *xtw is only valid for signed 64-bit operations.
					if (Is64Bit && IsSigned)
						AsmMnemonic = "sxtw";
					break;
			}

			if (AsmMnemonic) {
				SStream_concat(O, "%s\t%s, %s", AsmMnemonic,
						getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
						getRegisterName(getWRegFromXReg(MCOperand_getReg(Op1)), AArch64_NoRegAltName));

				if (MI->csh->detail) {
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
					MI->flat_insn->detail->arm64.op_count++;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = getWRegFromXReg(MCOperand_getReg(Op1));
					MI->flat_insn->detail->arm64.op_count++;
				}

				MCInst_setOpcodePub(MI, AArch64_map_insn(AsmMnemonic));

				return;
			}
		}

		// All immediate shifts are aliases, implemented using the Bitfield
		// instruction. In all cases the immediate shift amount shift must be in
		// the range 0 to (reg.size -1).
		if (MCOperand_isImm(Op2) && MCOperand_isImm(Op3)) {
			char *AsmMnemonic = NULL;
			int shift = 0;
			int immr = (int)MCOperand_getImm(Op2);
			int imms = (int)MCOperand_getImm(Op3);

			if (Opcode == AArch64_UBFMWri && imms != 0x1F && ((imms + 1) == immr)) {
				AsmMnemonic = "lsl";
				shift = 31 - imms;
			} else if (Opcode == AArch64_UBFMXri && imms != 0x3f &&
					((imms + 1 == immr))) {
				AsmMnemonic = "lsl";
				shift = 63 - imms;
			} else if (Opcode == AArch64_UBFMWri && imms == 0x1f) {
				AsmMnemonic = "lsr";
				shift = immr;
			} else if (Opcode == AArch64_UBFMXri && imms == 0x3f) {
				AsmMnemonic = "lsr";
				shift = immr;
			} else if (Opcode == AArch64_SBFMWri && imms == 0x1f) {
				AsmMnemonic = "asr";
				shift = immr;
			} else if (Opcode == AArch64_SBFMXri && imms == 0x3f) {
				AsmMnemonic = "asr";
				shift = immr;
			}

			if (AsmMnemonic) {
				SStream_concat(O, "%s\t%s, %s, ", AsmMnemonic,
						getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
						getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));

				printInt32Bang(O, shift);

				MCInst_setOpcodePub(MI, AArch64_map_insn(AsmMnemonic));

				if (MI->csh->detail) {
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
					MI->flat_insn->detail->arm64.op_count++;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
					MI->flat_insn->detail->arm64.op_count++;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = shift;
					MI->flat_insn->detail->arm64.op_count++;
				}

				return;
			}
		}

		// SBFIZ/UBFIZ aliases
		if (MCOperand_getImm(Op2) > MCOperand_getImm(Op3)) {
			SStream_concat(O, "%s\t%s, %s, ", (IsSigned ? "sbfiz" : "ubfiz"),
					getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
					getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));
			printInt32Bang(O, (int)((Is64Bit ? 64 : 32) - MCOperand_getImm(Op2)));
			SStream_concat0(O, ", ");
			printInt32Bang(O, (int)MCOperand_getImm(Op3) + 1);

			MCInst_setOpcodePub(MI, AArch64_map_insn(IsSigned ? "sbfiz" : "ubfiz"));

			if (MI->csh->detail) {
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (Is64Bit ? 64 : 32) - (int)MCOperand_getImm(Op2);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)MCOperand_getImm(Op3) + 1;
				MI->flat_insn->detail->arm64.op_count++;
			}

			return;
		}

		// Otherwise SBFX/UBFX is the preferred form
		SStream_concat(O, "%s\t%s, %s, ", (IsSigned ? "sbfx" : "ubfx"),
				getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
				getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));
		printInt32Bang(O, (int)MCOperand_getImm(Op2));
		SStream_concat0(O, ", ");
		printInt32Bang(O, (int)MCOperand_getImm(Op3) - (int)MCOperand_getImm(Op2) + 1);

		MCInst_setOpcodePub(MI, AArch64_map_insn(IsSigned ? "sbfx" : "ubfx"));

		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)MCOperand_getImm(Op2);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)MCOperand_getImm(Op3) - (int)MCOperand_getImm(Op2) + 1;
			MI->flat_insn->detail->arm64.op_count++;
		}

		return;
	}

	if (Opcode == AArch64_BFMXri || Opcode == AArch64_BFMWri) {
		MCOperand *Op0 = MCInst_getOperand(MI, 0); // Op1 == Op0
		MCOperand *Op2 = MCInst_getOperand(MI, 2);
		int ImmR = (int)MCOperand_getImm(MCInst_getOperand(MI, 3));
		int ImmS = (int)MCOperand_getImm(MCInst_getOperand(MI, 4));

		// BFI alias
		if (ImmS < ImmR) {
			int BitWidth = Opcode == AArch64_BFMXri ? 64 : 32;
			LSB = (BitWidth - ImmR) % BitWidth;
			Width = ImmS + 1;

			SStream_concat(O, "bfi\t%s, %s, ",
					getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
					getRegisterName(MCOperand_getReg(Op2), AArch64_NoRegAltName));
			printInt32Bang(O, LSB);
			SStream_concat0(O, ", ");
			printInt32Bang(O, Width);
			MCInst_setOpcodePub(MI, AArch64_map_insn("bfi"));

			if (MI->csh->detail) {
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op2);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = LSB;
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Width;
				MI->flat_insn->detail->arm64.op_count++;
			}

			return;
		}

		LSB = ImmR;
		Width = ImmS - ImmR + 1;
		// Otherwise BFXIL the preferred form
		SStream_concat(O, "bfxil\t%s, %s, ",
				getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
				getRegisterName(MCOperand_getReg(Op2), AArch64_NoRegAltName));
		printInt32Bang(O, LSB);
		SStream_concat0(O, ", ");
		printInt32Bang(O, Width);
		MCInst_setOpcodePub(MI, AArch64_map_insn("bfxil"));

		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op2);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = LSB;
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Width;
			MI->flat_insn->detail->arm64.op_count++;
		}

		return;
	}

	mnem = printAliasInstr(MI, O, Info);
	if (mnem) {
		MCInst_setOpcodePub(MI, AArch64_map_insn(mnem));
		cs_mem_free(mnem);
	} else {
		printInstruction(MI, O, Info);
	}
}